

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

Value * __thiscall
minja::ArrayExpr::do_evaluate
          (Value *__return_storage_ptr__,ArrayExpr *this,shared_ptr<minja::Context> *context)

{
  pointer psVar1;
  Expression *this_00;
  runtime_error *this_01;
  pointer psVar2;
  vector<minja::Value,_std::allocator<minja::Value>_> local_98;
  Value local_78;
  
  local_98.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Value::array(__return_storage_ptr__,&local_98);
  std::vector<minja::Value,_std::allocator<minja::Value>_>::~vector(&local_98);
  psVar2 = (this->elements).
           super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->elements).
           super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (psVar2 == psVar1) {
      return __return_storage_ptr__;
    }
    this_00 = (psVar2->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (this_00 == (Expression *)0x0) break;
    Expression::evaluate(&local_78,this_00,context);
    Value::push_back(__return_storage_ptr__,&local_78);
    Value::~Value(&local_78);
    psVar2 = psVar2 + 1;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Array element is null");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Value do_evaluate(const std::shared_ptr<Context> & context) const override {
        auto result = Value::array();
        for (const auto& e : elements) {
            if (!e) throw std::runtime_error("Array element is null");
            result.push_back(e->evaluate(context));
        }
        return result;
    }